

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-t32.inc.c
# Opt level: O0

void disas_t32_extract_s_rri_rot(DisasContext_conflict1 *ctx,arg_s_rri_rot *a,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t insn_local;
  arg_s_rri_rot *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32(insn,0x14,1);
  a->s = uVar1;
  uVar1 = extract32(insn,0x10,4);
  a->rn = uVar1;
  uVar1 = extract32(insn,8,4);
  a->rd = uVar1;
  uVar1 = extract32(insn,0,8);
  uVar2 = extract32(insn,0xc,3);
  uVar1 = deposit32(uVar1,8,0x18,uVar2);
  uVar2 = extract32(insn,0x1a,1);
  uVar1 = deposit32(uVar1,0xb,0x15,uVar2);
  iVar3 = t32_expandimm_imm(ctx,uVar1);
  a->imm = iVar3;
  uVar1 = extract32(insn,0,8);
  uVar2 = extract32(insn,0xc,3);
  uVar1 = deposit32(uVar1,8,0x18,uVar2);
  uVar2 = extract32(insn,0x1a,1);
  uVar1 = deposit32(uVar1,0xb,0x15,uVar2);
  iVar3 = t32_expandimm_rot(ctx,uVar1);
  a->rot = iVar3;
  return;
}

Assistant:

static void disas_t32_extract_s_rri_rot(DisasContext *ctx, arg_s_rri_rot *a, uint32_t insn)
{
    a->s = extract32(insn, 20, 1);
    a->rn = extract32(insn, 16, 4);
    a->rd = extract32(insn, 8, 4);
    a->imm = t32_expandimm_imm(ctx, deposit32(deposit32(extract32(insn, 0, 8), 8, 24, extract32(insn, 12, 3)), 11, 21, extract32(insn, 26, 1)));
    a->rot = t32_expandimm_rot(ctx, deposit32(deposit32(extract32(insn, 0, 8), 8, 24, extract32(insn, 12, 3)), 11, 21, extract32(insn, 26, 1)));
}